

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_HostTrap_Test::TestBody(InterpTest_HostTrap_Test *this)

{
  initializer_list<wabt::interp::Ref> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  HostFunc *this_00;
  char *pcVar2;
  Trap *this_01;
  Ptr *in_R9;
  AssertHelper local_348;
  Message local_340;
  string local_338;
  undefined1 local_318 [8];
  AssertionResult gtest_ar;
  string local_300;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_;
  Ref local_2b8;
  iterator local_2b0;
  size_type local_2a8;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_2a0;
  Store *local_288;
  Ptr local_280;
  undefined1 local_268 [8];
  RefPtr<wabt::interp::Trap> trap;
  Ptr local_130;
  anon_class_8_1_8991fb9c local_118;
  Callback local_110;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_f0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d8;
  FuncType local_c0;
  undefined1 local_80 [8];
  Ptr host_func;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_HostTrap_Test *local_10;
  InterpTest_HostTrap_Test *this_local;
  
  local_10 = this;
  memcpy((void *)((long)&host_func.root_index_ + 7),&DAT_0030d5f3,0x29);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 6));
  __l_00._M_len = 0x29;
  __l_00._M_array = (iterator)((long)&host_func.root_index_ + 7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_00,(allocator_type *)((long)&host_func.root_index_ + 6));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 6));
  memset(&local_d8,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_d8);
  memset(&local_f0,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_f0);
  wabt::interp::FuncType::FuncType(&local_c0,&local_d8,&local_f0);
  local_118.this = this;
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_HostTrap_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_110,&local_118);
  wabt::interp::HostFunc::New((Ptr *)local_80,&(this->super_InterpTest).store_,&local_c0,&local_110)
  ;
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_110);
  wabt::interp::FuncType::~FuncType(&local_c0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_f0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_d8);
  wabt::interp::ModuleDesc::ModuleDesc
            ((ModuleDesc *)&trap.root_index_,&(this->super_InterpTest).module_desc_);
  wabt::interp::Module::New
            (&local_130,&(this->super_InterpTest).store_,(ModuleDesc *)&trap.root_index_);
  wabt::interp::RefPtr<wabt::interp::Module>::operator=(&(this->super_InterpTest).mod_,&local_130);
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr(&local_130);
  wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&trap.root_index_);
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_268);
  local_288 = (Store *)wabt::interp::RefPtr<wabt::interp::Module>::ref
                                 (&(this->super_InterpTest).mod_);
  this_00 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                      ((RefPtr<wabt::interp::HostFunc> *)local_80);
  local_2b8 = wabt::interp::Object::self((Object *)this_00);
  local_2b0 = &local_2b8;
  local_2a8 = 1;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  __l._M_len = local_2a8;
  __l._M_array = local_2b0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_2a0,__l,
             (allocator_type *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  wabt::interp::Instance::Instantiate
            (&local_280,(Instance *)&(this->super_InterpTest).store_,local_288,(Ref)&local_2a0,
             (RefVec *)local_268,in_R9);
  wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr(&local_280);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_2a0);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::AssertionResult::AssertionResult<wabt::interp::RefPtr<wabt::interp::Trap>>
            ((AssertionResult *)local_2d0,(RefPtr<wabt::interp::Trap> *)local_268,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_300,(internal *)local_2d0,(AssertionResult *)0x323670,"false","true",
               (char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x192,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    testing::Message::~Message(&local_2d8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    this_01 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)local_268);
    wabt::interp::Trap::message_abi_cxx11_(&local_338,this_01);
    testing::internal::EqHelper::
    Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_318,"\"boom\"","trap->message()",(char (*) [5])"boom",&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
    if (!bVar1) {
      testing::Message::Message(&local_340);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x193,pcVar2);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      testing::Message::~Message(&local_340);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_268);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_80);
  return;
}

Assistant:

TEST_F(InterpTest, HostTrap) {
  // (import "host" "a" (func $0))
  // (func $1 call $0)
  // (start $1)
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x02, 0x0a, 0x01, 0x04, 0x68, 0x6f, 0x73, 0x74,
      0x01, 0x61, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x08, 0x01, 0x01,
      0x0a, 0x06, 0x01, 0x04, 0x00, 0x10, 0x00, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{}, {}},
                    [&](Thread& thread, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      *out_trap = Trap::New(store_, "boom");
                      return Result::Error;
                    });

  mod_ = Module::New(store_, module_desc_);
  RefPtr<Trap> trap;
  Instance::Instantiate(store_, mod_.ref(), {host_func->self()}, &trap);

  ASSERT_TRUE(trap);
  ASSERT_EQ("boom", trap->message());
}